

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O2

Status __thiscall
soplex::SoPlexBase<double>::_solveRealStable
          (SoPlexBase<double> *this,bool acceptUnbounded,bool acceptInfeasible,
          VectorBase<double> *primal,VectorBase<double> *dual,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *basisStatusRows,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *basisStatusCols,
          bool forceNoSimplifier)

{
  SPxSolverBase<double> *this_00;
  int value;
  int value_00;
  int iVar1;
  int value_01;
  int value_02;
  Verbosity VVar2;
  Settings *pSVar3;
  bool bVar4;
  int value_03;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  Status SVar11;
  SPxOut *pSVar12;
  SPxOut *pSVar13;
  bool bVar14;
  Verbosity old_verbosity_2;
  bool bVar15;
  Verbosity old_verbosity;
  bool bVar16;
  Verbosity old_verbosity_1;
  bool fromscratch;
  double dVar17;
  double dVar18;
  double dVar19;
  
  dVar19 = (this->_slufactor).lastThreshold;
  pSVar3 = this->_currentSettings;
  value = pSVar3->_intParamValues[0xe];
  value_00 = pSVar3->_intParamValues[0xd];
  iVar1 = pSVar3->_intParamValues[2];
  value_01 = pSVar3->_intParamValues[10];
  value_02 = pSVar3->_intParamValues[0xb];
  if (forceNoSimplifier) {
    setIntParam(this,SIMPLIFIER,0,true);
  }
  pSVar13 = &this->spxout;
  this_00 = &this->_solver;
  bVar15 = true;
  bVar5 = false;
  bVar6 = false;
  bVar8 = false;
  bVar9 = false;
  bVar7 = false;
  bVar4 = false;
  bVar10 = false;
  bVar14 = false;
  bVar16 = false;
  fromscratch = false;
LAB_0028e2bd:
  SVar11 = _solveRealForRational(this,fromscratch,primal,dual,basisStatusRows,basisStatusCols);
  if (SVar11 == INFEASIBLE) {
    if (acceptInfeasible) goto LAB_0028e985;
  }
  else if (SVar11 == OPTIMAL) goto LAB_0028e985;
  if ((acceptUnbounded && SVar11 == UNBOUNDED) || ((uint)(SVar11 + (INForUNBD|INFEASIBLE)) < 2))
  goto LAB_0028e985;
  if ((bVar15) && (VVar2 = (this->spxout).m_verbosity, 2 < (int)VVar2)) {
    (this->spxout).m_verbosity = INFO1;
    pSVar12 = soplex::operator<<(pSVar13,"Numerical troubles during floating-point solve.");
    std::endl<char,std::char_traits<char>>(pSVar12->m_streams[pSVar12->m_verbosity]);
    (this->spxout).m_verbosity = VVar2;
  }
  if ((bVar7) ||
     ((this->_currentSettings->_intParamValues[10] == 0 &&
      (this->_currentSettings->_intParamValues[0xb] == 0)))) {
    setIntParam(this,SCALER,value_02,true);
    setIntParam(this,SIMPLIFIER,value_01,true);
    if (!bVar14) {
      VVar2 = (this->spxout).m_verbosity;
      if (2 < (int)VVar2) {
        (this->spxout).m_verbosity = INFO1;
        pSVar12 = soplex::operator<<(pSVar13,"Increasing Markowitz threshold.");
        std::endl<char,std::char_traits<char>>(pSVar12->m_streams[pSVar12->m_verbosity]);
        (this->spxout).m_verbosity = VVar2;
      }
      (this->_slufactor).lastThreshold = 0.9;
      (this->_slufactor).minThreshold = 0.9;
      bVar14 = true;
      bVar15 = false;
      SPxSolverBase<double>::factorize(this_00);
      goto LAB_0028e2bd;
    }
    if (!bVar16) {
      VVar2 = (this->spxout).m_verbosity;
      bVar14 = true;
      bVar15 = false;
      bVar16 = true;
      fromscratch = true;
      if (2 < (int)VVar2) {
        (this->spxout).m_verbosity = INFO1;
        pSVar12 = soplex::operator<<(pSVar13,"Solving from scratch.");
        std::endl<char,std::char_traits<char>>(pSVar12->m_streams[pSVar12->m_verbosity]);
        (this->spxout).m_verbosity = VVar2;
        goto LAB_0028e52d;
      }
      goto LAB_0028e2bd;
    }
    setIntParam(this,RATIOTESTER,value,true);
    setIntParam(this,PRICER,value_00,true);
    if (bVar5) {
      if (bVar6 || forceNoSimplifier) {
        setIntParam(this,SIMPLIFIER,0,true);
        if (bVar10) {
          if (SVar11 == INFEASIBLE || bVar4) {
            if ((DAT_0054a578 <= iVar1) && (iVar1 <= DAT_0054a5e8)) {
              this->_currentSettings->_intParamValues[2] = iVar1;
            }
            VVar2 = (this->spxout).m_verbosity;
            if (bVar8) {
              if (bVar9) {
                if (2 < (int)VVar2) {
                  (this->spxout).m_verbosity = INFO1;
                  pSVar13 = soplex::operator<<(pSVar13,"Giving up.");
                  std::endl<char,std::char_traits<char>>(pSVar13->m_streams[pSVar13->m_verbosity]);
                  (this->spxout).m_verbosity = VVar2;
                }
LAB_0028e985:
                dVar17 = 0.0001;
                if (0.0001 <= dVar19) {
                  dVar17 = dVar19;
                }
                dVar19 = 0.9999;
                if (dVar17 <= 0.9999) {
                  dVar19 = dVar17;
                }
                (this->_slufactor).minThreshold = dVar19;
                (this->_slufactor).lastThreshold = dVar19;
                setIntParam(this,RATIOTESTER,value,true);
                setIntParam(this,PRICER,value_00,true);
                setIntParam(this,SIMPLIFIER,value_01,true);
                setIntParam(this,SCALER,value_02,true);
                if ((DAT_0054a578 <= iVar1) && (iVar1 <= DAT_0054a5e8)) {
                  this->_currentSettings->_intParamValues[2] = iVar1;
                }
                return SVar11;
              }
              if (2 < (int)VVar2) {
                (this->spxout).m_verbosity = INFO1;
                pSVar12 = soplex::operator<<(pSVar13,"Switching pricer.");
                std::endl<char,std::char_traits<char>>(pSVar12->m_streams[pSVar12->m_verbosity]);
                (this->spxout).m_verbosity = VVar2;
              }
              SPxSolverBase<double>::setType
                        (this_00,(uint)((this->_solver).theType != LEAVE) * 2 + ENTER);
              if ((SPxDevexPR<double> *)(this->_solver).thepricer == &this->_pricerDevex) {
                value_03 = 5;
              }
              else {
                value_03 = 3;
              }
              setIntParam(this,PRICER,value_03,true);
              bVar8 = true;
              bVar9 = true;
            }
            else {
              if (2 < (int)VVar2) {
                (this->spxout).m_verbosity = INFO1;
                pSVar12 = soplex::operator<<(pSVar13,"Switching ratio test.");
                std::endl<char,std::char_traits<char>>(pSVar12->m_streams[pSVar12->m_verbosity]);
                (this->spxout).m_verbosity = VVar2;
              }
              SPxSolverBase<double>::setType
                        (this_00,(uint)((this->_solver).theType != LEAVE) * 2 + ENTER);
              if ((this->_solver).theratiotester ==
                  &(this->_ratiotesterTextbook).super_SPxRatioTester<double>) {
                setIntParam(this,RATIOTESTER,2,true);
              }
              else {
                setIntParam(this,RATIOTESTER,0,true);
              }
              bVar8 = true;
            }
          }
          else {
            VVar2 = (this->spxout).m_verbosity;
            if (2 < (int)VVar2) {
              (this->spxout).m_verbosity = INFO1;
              pSVar12 = soplex::operator<<(pSVar13,"Tightening tolerances.");
              std::endl<char,std::char_traits<char>>(pSVar12->m_streams[pSVar12->m_verbosity]);
              (this->spxout).m_verbosity = VVar2;
            }
            if ((DAT_0054a578 < 2) && (0 < DAT_0054a5e8)) {
              this->_currentSettings->_intParamValues[2] = 1;
            }
            dVar17 = SPxSolverBase<double>::entertol(this_00);
            dVar18 = 0.001;
            if (dVar17 < 1e-06) {
              dVar18 = SPxSolverBase<double>::entertol(this_00);
              dVar18 = 1e-09 / dVar18;
            }
            (this->_solver).entertolscale = dVar18;
            dVar17 = SPxSolverBase<double>::entertol(this_00);
            bVar4 = dVar17 <= 1e-09;
          }
          bVar10 = true;
        }
        else {
          VVar2 = (this->spxout).m_verbosity;
          if (2 < (int)VVar2) {
            (this->spxout).m_verbosity = INFO1;
            pSVar12 = soplex::operator<<(pSVar13,"Relaxing tolerances.");
            std::endl<char,std::char_traits<char>>(pSVar12->m_streams[pSVar12->m_verbosity]);
            (this->spxout).m_verbosity = VVar2;
          }
          if ((DAT_0054a578 < 1) && (-1 < DAT_0054a5e8)) {
            this->_currentSettings->_intParamValues[2] = 0;
          }
          dVar17 = SPxSolverBase<double>::entertol(this_00);
          dVar18 = 1000.0;
          if (1e-06 < dVar17) {
            dVar18 = SPxSolverBase<double>::entertol(this_00);
            dVar18 = 0.001 / dVar18;
          }
          (this->_solver).entertolscale = dVar18;
          dVar17 = SPxSolverBase<double>::leavetol(this_00);
          dVar18 = 1000.0;
          if (1e-06 < dVar17) {
            dVar18 = SPxSolverBase<double>::leavetol(this_00);
            dVar18 = 0.001 / dVar18;
          }
          (this->_solver).leavetolscale = dVar18;
          dVar17 = SPxSolverBase<double>::entertol(this_00);
          bVar10 = 0.001 <= dVar17;
        }
        bVar5 = true;
        bVar15 = false;
        bVar14 = true;
        bVar16 = false;
        goto LAB_0028e2bd;
      }
      VVar2 = (this->spxout).m_verbosity;
      if (2 < (int)VVar2) {
        (this->spxout).m_verbosity = INFO1;
        pSVar12 = soplex::operator<<(pSVar13,"Switching simplification.");
        std::endl<char,std::char_traits<char>>(pSVar12->m_streams[pSVar12->m_verbosity]);
        (this->spxout).m_verbosity = VVar2;
      }
      if (value_01 == 0) {
        setIntParam(this,SIMPLIFIER,3,true);
      }
      else {
        setIntParam(this,SIMPLIFIER,0,true);
      }
      bVar6 = true;
    }
    else {
      VVar2 = (this->spxout).m_verbosity;
      if (2 < (int)VVar2) {
        (this->spxout).m_verbosity = INFO1;
        pSVar12 = soplex::operator<<(pSVar13,"Switching scaling.");
        std::endl<char,std::char_traits<char>>(pSVar12->m_streams[pSVar12->m_verbosity]);
        (this->spxout).m_verbosity = VVar2;
      }
      if (value_02 == 0) {
        setIntParam(this,SCALER,2,true);
      }
      else {
        setIntParam(this,SCALER,0,true);
      }
    }
    bVar5 = true;
    bVar14 = true;
  }
  else {
    VVar2 = (this->spxout).m_verbosity;
    if (2 < (int)VVar2) {
      (this->spxout).m_verbosity = INFO1;
      pSVar12 = soplex::operator<<(pSVar13,"Turning off preprocessing.");
      std::endl<char,std::char_traits<char>>(pSVar12->m_streams[pSVar12->m_verbosity]);
      (this->spxout).m_verbosity = VVar2;
    }
    setIntParam(this,SCALER,0,true);
    setIntParam(this,SIMPLIFIER,0,true);
    bVar7 = true;
  }
LAB_0028e52d:
  bVar15 = false;
  bVar16 = true;
  fromscratch = true;
  goto LAB_0028e2bd;
}

Assistant:

typename SPxSolverBase<R>::Status SoPlexBase<R>::_solveRealStable(bool acceptUnbounded,
      bool acceptInfeasible, VectorBase<R>& primal, VectorBase<R>& dual,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusRows,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusCols,
      const bool forceNoSimplifier)
{
   typename SPxSolverBase<R>::Status result = SPxSolverBase<R>::UNKNOWN;

   bool fromScratch = false;
   bool solved = false;
   bool solvedFromScratch = false;
   bool initialSolve = true;
   bool increasedMarkowitz = false;
   bool relaxedTolerances = false;
   bool tightenedTolerances = false;
   bool switchedScaler = false;
   bool switchedSimplifier = false;
   bool switchedRatiotester = false;
   bool switchedPricer = false;
   bool turnedoffPre = false;

   R markowitz = _slufactor.markowitz();
   int ratiotester = intParam(SoPlexBase<R>::RATIOTESTER);
   int pricer = intParam(SoPlexBase<R>::PRICER);
   int simplifier = intParam(SoPlexBase<R>::SIMPLIFIER);
   int scaler = intParam(SoPlexBase<R>::SCALER);
   int type = intParam(SoPlexBase<R>::ALGORITHM);

   if(forceNoSimplifier)
      setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

   while(true)
   {
      assert(!increasedMarkowitz || GE(_slufactor.markowitz(), R(0.9), this->tolerances()->epsilon()));

      result = _solveRealForRational(fromScratch, primal, dual, basisStatusRows, basisStatusCols);

      solved = (result == SPxSolverBase<R>::OPTIMAL)
               || (result == SPxSolverBase<R>::INFEASIBLE && acceptInfeasible)
               || (result == SPxSolverBase<R>::UNBOUNDED && acceptUnbounded);

      if(solved || result == SPxSolverBase<R>::ABORT_TIME || result == SPxSolverBase<R>::ABORT_ITER)
         break;

      if(initialSolve)
      {
         SPX_MSG_INFO1(spxout, spxout << "Numerical troubles during floating-point solve." << std::endl);
         initialSolve = false;
      }

      if(!turnedoffPre
            && (intParam(SoPlexBase<R>::SIMPLIFIER) != SoPlexBase<R>::SIMPLIFIER_OFF
                || intParam(SoPlexBase<R>::SCALER) != SoPlexBase<R>::SCALER_OFF))
      {
         SPX_MSG_INFO1(spxout, spxout << "Turning off preprocessing." << std::endl);

         turnedoffPre = true;

         setIntParam(SoPlexBase<R>::SCALER, SoPlexBase<R>::SCALER_OFF);
         setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

         fromScratch = true;
         solvedFromScratch = true;
         continue;
      }

      setIntParam(SoPlexBase<R>::SCALER, scaler);
      setIntParam(SoPlexBase<R>::SIMPLIFIER, simplifier);

      if(!increasedMarkowitz)
      {
         SPX_MSG_INFO1(spxout, spxout << "Increasing Markowitz threshold." << std::endl);

         _slufactor.setMarkowitz(0.9);
         increasedMarkowitz = true;

         try
         {
            _solver.factorize();
            continue;
         }
         catch(...)
         {
            SPxOut::debug(this, "Factorization failed.\n");
         }
      }

      if(!solvedFromScratch)
      {
         SPX_MSG_INFO1(spxout, spxout << "Solving from scratch." << std::endl);

         fromScratch = true;
         solvedFromScratch = true;
         continue;
      }

      setIntParam(SoPlexBase<R>::RATIOTESTER, ratiotester);
      setIntParam(SoPlexBase<R>::PRICER, pricer);

      if(!switchedScaler)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching scaling." << std::endl);

         if(scaler == int(SoPlexBase<R>::SCALER_OFF))
            setIntParam(SoPlexBase<R>::SCALER, SoPlexBase<R>::SCALER_BIEQUI);
         else
            setIntParam(SoPlexBase<R>::SCALER, SoPlexBase<R>::SCALER_OFF);

         fromScratch = true;
         solvedFromScratch = true;
         switchedScaler = true;
         continue;
      }

      if(!switchedSimplifier && !forceNoSimplifier)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching simplification." << std::endl);

         if(simplifier == int(SoPlexBase<R>::SIMPLIFIER_OFF))
            setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_INTERNAL);
         else
            setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

         fromScratch = true;
         solvedFromScratch = true;
         switchedSimplifier = true;
         continue;
      }

      setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

      if(!relaxedTolerances)
      {
         SPX_MSG_INFO1(spxout, spxout << "Relaxing tolerances." << std::endl);

         setIntParam(SoPlexBase<R>::ALGORITHM, SoPlexBase<R>::ALGORITHM_PRIMAL);

         // scale tols by up 1e3 but so that they do not exceed 1e-3
         if(_solver.entertol() > 1e-6)
            _solver.scaleEntertol(1e-3 / _solver.entertol());
         else
            _solver.scaleEntertol(1e3);

         if(_solver.leavetol() > 1e-6)
            _solver.scaleLeavetol(1e-3 / _solver.leavetol());
         else
            _solver.scaleLeavetol(1e3);

         relaxedTolerances = _solver.entertol() >= 1e-3;
         solvedFromScratch = false;
         continue;
      }

      if(!tightenedTolerances && result != SPxSolverBase<R>::INFEASIBLE)
      {
         SPX_MSG_INFO1(spxout, spxout << "Tightening tolerances." << std::endl);

         setIntParam(SoPlexBase<R>::ALGORITHM, SoPlexBase<R>::ALGORITHM_DUAL);

         // scale tols by up 1e-3 but so that they are not smaller than 1e-9
         if(_solver.entertol() < 1e-6)
            _solver.scaleEntertol(1e-9 / _solver.entertol());
         else
            _solver.scaleEntertol(1e-3);

         tightenedTolerances = _solver.entertol() <= 1e-9;
         solvedFromScratch = false;
         continue;
      }

      setIntParam(SoPlexBase<R>::ALGORITHM, type);

      if(!switchedRatiotester)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching ratio test." << std::endl);

         _solver.setType(_solver.type() == SPxSolverBase<R>::LEAVE ? SPxSolverBase<R>::ENTER :
                         SPxSolverBase<R>::LEAVE);

         if(_solver.ratiotester() != (SPxRatioTester<R>*)&_ratiotesterTextbook)
            setIntParam(SoPlexBase<R>::RATIOTESTER, RATIOTESTER_TEXTBOOK);
         else
            setIntParam(SoPlexBase<R>::RATIOTESTER, RATIOTESTER_FAST);

         switchedRatiotester = true;
         solvedFromScratch = false;
         continue;
      }

      if(!switchedPricer)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching pricer." << std::endl);

         _solver.setType(_solver.type() == SPxSolverBase<R>::LEAVE ? SPxSolverBase<R>::ENTER :
                         SPxSolverBase<R>::LEAVE);

         if(_solver.pricer() != (SPxPricer<R>*)&_pricerDevex)
            setIntParam(SoPlexBase<R>::PRICER, PRICER_DEVEX);
         else
            setIntParam(SoPlexBase<R>::PRICER, PRICER_STEEP);

         switchedPricer = true;
         solvedFromScratch = false;
         continue;
      }

      SPX_MSG_INFO1(spxout, spxout << "Giving up." << std::endl);

      break;
   }

   _slufactor.setMarkowitz(markowitz);

   setIntParam(SoPlexBase<R>::RATIOTESTER, ratiotester);
   setIntParam(SoPlexBase<R>::PRICER, pricer);
   setIntParam(SoPlexBase<R>::SIMPLIFIER, simplifier);
   setIntParam(SoPlexBase<R>::SCALER, scaler);
   setIntParam(SoPlexBase<R>::ALGORITHM, type);

   return result;
}